

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

void interpolate(uint8_t *input,int in_length,uint8_t *output,int out_length)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  int iVar12;
  uint8_t uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int16_t (*local_40) [8];
  
  if (out_length < in_length) {
    iVar12 = out_length * 0x10;
    if (iVar12 < in_length * 0xd) {
      if (iVar12 < in_length * 0xb) {
        local_40 = filteredinterp_filters625;
        if (SBORROW4(iVar12,in_length * 9) != iVar12 + in_length * -9 < 0) {
          local_40 = filteredinterp_filters500;
        }
      }
      else {
        local_40 = filteredinterp_filters750;
      }
    }
    else {
      local_40 = filteredinterp_filters875;
    }
  }
  else {
    local_40 = av1_resize_filter_normative;
  }
  iVar16 = out_length / 2;
  iVar18 = 0;
  uVar15 = (uint)(in_length * 0x4000 + iVar16) / (uint)out_length;
  iVar12 = -iVar16;
  if (in_length - out_length != 0 && out_length <= in_length) {
    iVar12 = iVar16;
  }
  iVar12 = ((in_length - out_length) * 0x2000 + iVar12) / out_length;
  uVar14 = iVar12 + 0x80;
  if (iVar12 < 0xbf80) {
    iVar18 = 0;
    uVar17 = uVar14;
    do {
      iVar18 = iVar18 + 1;
      uVar17 = uVar17 + uVar15;
    } while ((int)uVar17 < 0xc000);
  }
  iVar16 = out_length + -1;
  for (iVar12 = iVar12 + uVar15 * iVar16 + 0x80; in_length <= (iVar12 >> 0xe) + 4;
      iVar12 = iVar12 - uVar15) {
    iVar16 = iVar16 + -1;
  }
  if (iVar16 < iVar18) {
    if (0 < out_length) {
      iVar12 = 0;
      do {
        lVar20 = 0;
        iVar18 = 0;
        do {
          uVar17 = ((int)uVar14 >> 0xe) + -3 + (int)lVar20;
          if ((int)(in_length - 1U) <= (int)uVar17) {
            uVar17 = in_length - 1U;
          }
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          iVar18 = iVar18 + (uint)input[uVar17] *
                            (int)*(short *)((long)*local_40 +
                                           lVar20 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
          lVar20 = lVar20 + 1;
        } while (lVar20 != 8);
        iVar18 = iVar18 + 0x40 >> 7;
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        if (0xfe < iVar18) {
          iVar18 = 0xff;
        }
        *output = (uint8_t)iVar18;
        output = output + 1;
        iVar12 = iVar12 + 1;
        uVar14 = uVar14 + uVar15;
      } while (iVar12 != out_length);
    }
  }
  else {
    if (iVar18 == 0) {
      iVar18 = 0;
    }
    else {
      iVar12 = 0;
      do {
        lVar20 = 0;
        iVar19 = 0;
        do {
          uVar17 = (int)lVar20 + ((int)uVar14 >> 0xe) + -3;
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          iVar19 = iVar19 + (uint)input[uVar17] *
                            (int)*(short *)((long)*local_40 +
                                           lVar20 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
          lVar20 = lVar20 + 1;
        } while (lVar20 != 8);
        uVar17 = iVar19 + 0x40 >> 7;
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        if (0xfe < (int)uVar17) {
          uVar17 = 0xff;
        }
        *output = (uint8_t)uVar17;
        output = output + 1;
        iVar12 = iVar12 + 1;
        uVar14 = uVar14 + uVar15;
      } while (iVar12 != iVar18);
    }
    if (iVar18 <= iVar16) {
      do {
        lVar20 = -3;
        lVar21 = 0;
        iVar12 = 0;
        iVar19 = 0;
        iVar23 = 0;
        iVar24 = 0;
        do {
          uVar1 = *(ulong *)((long)*local_40 + lVar21 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
          uVar2 = *(undefined4 *)(input + lVar20 + ((int)uVar14 >> 0xe));
          uVar9 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
          auVar6._8_4_ = 0;
          auVar6._0_8_ = uVar9;
          auVar6[0xc] = (char)((uint)uVar2 >> 0x18);
          auVar7[8] = (char)((uint)uVar2 >> 0x10);
          auVar7._0_8_ = uVar9;
          auVar7[9] = 0;
          auVar7._10_3_ = auVar6._10_3_;
          auVar10._5_8_ = 0;
          auVar10._0_5_ = auVar7._8_5_;
          auVar26._0_4_ = (undefined4)uVar9;
          auVar8[4] = (char)((uint)uVar2 >> 8);
          auVar8._0_4_ = auVar26._0_4_;
          auVar8[5] = 0;
          auVar8._6_7_ = SUB137(auVar10 << 0x40,6);
          auVar26._4_9_ = auVar8._4_9_;
          auVar26._13_3_ = 0;
          auVar3._8_4_ = 0;
          auVar3._0_8_ = uVar1;
          auVar3._12_2_ = (short)(uVar1 >> 0x30);
          auVar4._8_2_ = (short)(uVar1 >> 0x20);
          auVar4._0_8_ = uVar1;
          auVar4._10_4_ = auVar3._10_4_;
          auVar11._6_8_ = 0;
          auVar11._0_6_ = auVar4._8_6_;
          auVar5._4_2_ = (short)(uVar1 >> 0x10);
          auVar5._0_4_ = (uint)uVar1;
          auVar5._6_8_ = SUB148(auVar11 << 0x40,6);
          auVar25._0_4_ = (uint)uVar1 & 0xffff;
          auVar25._4_10_ = auVar5._4_10_;
          auVar25._14_2_ = 0;
          auVar25 = pmaddwd(auVar25,auVar26);
          iVar12 = iVar12 + auVar25._0_4_;
          iVar19 = iVar19 + auVar25._4_4_;
          iVar23 = iVar23 + auVar25._8_4_;
          iVar24 = iVar24 + auVar25._12_4_;
          lVar21 = lVar21 + 4;
          lVar20 = lVar20 + 4;
        } while (lVar20 != 5);
        iVar12 = iVar24 + iVar19 + iVar23 + iVar12 + 0x40 >> 7;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        uVar13 = (uint8_t)iVar12;
        if (0xfe < iVar12) {
          uVar13 = 0xff;
        }
        *output = uVar13;
        output = output + 1;
        uVar14 = uVar14 + uVar15;
        bVar22 = iVar18 != iVar16;
        iVar18 = iVar18 + 1;
      } while (bVar22);
      iVar18 = iVar16 + 1;
    }
    if (iVar18 < out_length) {
      do {
        lVar20 = 0;
        iVar12 = 0;
        do {
          iVar16 = ((int)uVar14 >> 0xe) + -3 + (int)lVar20;
          if (in_length + -1 <= iVar16) {
            iVar16 = in_length + -1;
          }
          iVar12 = iVar12 + (uint)input[iVar16] *
                            (int)*(short *)((long)*local_40 +
                                           lVar20 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
          lVar20 = lVar20 + 1;
        } while (lVar20 != 8);
        iVar16 = iVar12 + 0x40 >> 7;
        iVar12 = 0;
        if (0 < iVar16) {
          iVar12 = iVar16;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        *output = (uint8_t)iVar12;
        output = output + 1;
        iVar18 = iVar18 + 1;
        uVar14 = uVar14 + uVar15;
      } while (iVar18 != out_length);
    }
  }
  return;
}

Assistant:

static void interpolate(const uint8_t *const input, int in_length,
                        uint8_t *output, int out_length) {
  const InterpKernel *interp_filters =
      choose_interp_filter(in_length, out_length);

  interpolate_core(input, in_length, output, out_length, &interp_filters[0][0],
                   SUBPEL_TAPS);
}